

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

void __thiscall tcu::TestLog::TestLog(TestLog *this,char *fileName,deUint32 flags)

{
  qpTestLog *pqVar1;
  ResourceError *this_00;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  deUint32 local_1c;
  char *pcStack_18;
  deUint32 flags_local;
  char *fileName_local;
  TestLog *this_local;
  
  local_1c = flags;
  pcStack_18 = fileName;
  fileName_local = (char *)this;
  pqVar1 = qpTestLog_createFileLog(fileName,flags);
  this->m_log = pqVar1;
  if (this->m_log == (qpTestLog *)0x0) {
    this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"Failed to open test log file \'",&local_81);
    std::operator+(&local_60,&local_80,pcStack_18);
    std::operator+(&local_40,&local_60,"\'");
    ResourceError::ResourceError(this_00,&local_40);
    __cxa_throw(this_00,&ResourceError::typeinfo,ResourceError::~ResourceError);
  }
  return;
}

Assistant:

TestLog::TestLog (const char* fileName, deUint32 flags)
	: m_log(qpTestLog_createFileLog(fileName, flags))
{
	if (!m_log)
		throw ResourceError(std::string("Failed to open test log file '") + fileName + "'");
}